

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::Message::DebugString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  Printer printer;
  Printer PStack_98;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TextFormat::Printer::Printer(&PStack_98);
  PStack_98.expand_any_ = true;
  PStack_98.insert_silent_marker_ = (bool)(internal::enable_debug_text_format_marker & 1);
  TextFormat::Printer::PrintToString(&PStack_98,this,__return_storage_ptr__);
  TextFormat::Printer::~Printer(&PStack_98);
  return __return_storage_ptr__;
}

Assistant:

std::string Message::DebugString() const {
  std::string debug_string;

  TextFormat::Printer printer;
  printer.SetExpandAny(true);
  printer.SetInsertSilentMarker(internal::enable_debug_text_format_marker.load(
      std::memory_order_relaxed));

  printer.PrintToString(*this, &debug_string);

  return debug_string;
}